

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O0

hdr_histogram *
hdr_interval_recorder_sample_and_recycle
          (hdr_interval_recorder *r,hdr_histogram *histogram_to_recycle)

{
  hdr_histogram *phVar1;
  int significant_figures;
  int64_t hi;
  int64_t lo;
  hdr_histogram *old_active;
  hdr_histogram *histogram_to_recycle_local;
  hdr_interval_recorder *r_local;
  
  old_active = histogram_to_recycle;
  histogram_to_recycle_local = (hdr_histogram *)r;
  if (histogram_to_recycle == (hdr_histogram *)0x0) {
    hdr_init(r->active->lowest_discernible_value,r->active->highest_trackable_value,
             r->active->significant_figures,&old_active);
  }
  else {
    hdr_reset(histogram_to_recycle);
  }
  hdr_phaser_reader_lock((hdr_writer_reader_phaser *)&histogram_to_recycle_local->unit_magnitude);
  phVar1 = (hdr_histogram *)histogram_to_recycle_local->lowest_discernible_value;
  LOCK();
  histogram_to_recycle_local->lowest_discernible_value = (int64_t)old_active;
  UNLOCK();
  hdr_phaser_flip_phase((hdr_writer_reader_phaser *)&histogram_to_recycle_local->unit_magnitude,0);
  hdr_phaser_reader_unlock((hdr_writer_reader_phaser *)&histogram_to_recycle_local->unit_magnitude);
  return phVar1;
}

Assistant:

struct hdr_histogram* hdr_interval_recorder_sample_and_recycle(
    struct hdr_interval_recorder* r,
    struct hdr_histogram* histogram_to_recycle)
{
    struct hdr_histogram* old_active;

    if (NULL == histogram_to_recycle)
    {
        int64_t lo = r->active->lowest_discernible_value;
        int64_t hi = r->active->highest_trackable_value;
        int significant_figures = r->active->significant_figures;
        hdr_init(lo, hi, significant_figures, &histogram_to_recycle);
    }
    else
    {
        hdr_reset(histogram_to_recycle);
    }

    hdr_phaser_reader_lock(&r->phaser);

    /* volatile read */
    old_active = hdr_atomic_load_pointer(&r->active);

    /* volatile write */
    hdr_atomic_store_pointer(&r->active, histogram_to_recycle);

    hdr_phaser_flip_phase(&r->phaser, 0);

    hdr_phaser_reader_unlock(&r->phaser);

    return old_active;
}